

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLHelper.hpp
# Opt level: O0

void __thiscall TypeInfo::~TypeInfo(TypeInfo *this)

{
  TypeInfo *this_local;
  
  std::__cxx11::string::~string((string *)&this->postfix);
  std::__cxx11::string::~string((string *)&this->type);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

std::string compose( std::string const & nameSpace, std::string const & prefix_ = "Vk" ) const
  {
    return prefix + ( prefix.empty() ? "" : " " ) +
           ( nameSpace.empty() ? type : ( ( ( type.starts_with( prefix_ ) ) ? ( nameSpace + "::" ) : "" ) + stripPrefix( type, prefix_ ) ) ) +
           ( postfix.empty() ? "" : " " ) + postfix;
  }